

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture2DArrayView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  byte bVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  float fVar17;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar19;
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  Texture2DArrayView TVar28;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DArrayView src_1;
  float local_138 [8];
  float local_118 [8];
  float local_f8 [8];
  undefined1 local_d8 [4];
  undefined8 uStack_d4;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  pointer local_78;
  WrapMode local_68;
  ConstPixelBufferAccess *local_60;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  CompareMode CStack_4c;
  ulong local_48;
  undefined8 uStack_40;
  
  local_b8 = *texCoord;
  local_a8 = CONCAT44(local_a8._4_4_,texCoord[1]);
  fVar17 = texCoord[3];
  fVar19 = texCoord[6];
  fVar20 = texCoord[9];
  fVar21 = texCoord[4];
  fVar24 = texCoord[7];
  fVar1 = texCoord[10];
  local_c8 = texCoord[2];
  fVar2 = texCoord[5];
  fVar3 = texCoord[8];
  fVar4 = texCoord[0xb];
  local_88 = ZEXT416(0);
  local_78 = (pointer)0x0;
  TVar28 = tcu::getEffectiveTextureView
                     (src,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)local_88,&params->sampler);
  local_60 = TVar28.m_levels;
  local_68 = TVar28.m_numLevels;
  local_48 = 0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_48 = (ulong)(uint)(params->super_RenderParams).bias;
  }
  uStack_40 = 0;
  if ((int)local_68 < 1) {
    local_58 = 0.0;
    fStack_c4 = 0.0;
  }
  else {
    uVar5 = *(undefined8 *)(local_60->m_size).m_data;
    local_58 = (float)(int)uVar5;
    fStack_c4 = (float)(int)((ulong)uVar5 >> 0x20);
  }
  local_f8[0] = local_b8;
  local_118[0] = (float)local_a8;
  local_138[0] = local_c8;
  uStack_50._0_1_ = false;
  uStack_50._1_3_ = 0;
  CStack_4c = COMPAREMODE_NONE;
  fVar27 = (float)dst->m_width;
  fVar26 = (float)dst->m_height;
  local_138[1] = fVar2;
  local_138[2] = fVar3;
  local_138[3] = fVar4;
  local_138[4] = fVar3;
  local_138[5] = fVar2;
  local_118[1] = fVar21;
  local_118[2] = fVar24;
  local_118[3] = fVar1;
  local_118[4] = fVar24;
  local_118[5] = fVar21;
  local_f8[1] = fVar17;
  local_f8[2] = fVar19;
  local_f8[3] = fVar20;
  local_f8[4] = fVar19;
  local_f8[5] = fVar17;
  local_c8 = fStack_c4;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  fStack_54 = fStack_c4;
  local_b8 = computeLodFromDerivates
                       (params->lodMode,((fVar19 - local_b8) * local_58) / fVar27,
                        ((fVar24 - (float)local_a8) * fStack_c4) / fVar27,
                        ((fVar17 - local_b8) * local_58) / fVar26,
                        ((fVar21 - (float)local_a8) * fStack_c4) / fVar26);
  local_a8._0_4_ = params->minLod;
  local_a8._4_4_ = params->maxLod;
  uStack_a0._0_4_ = params->baseLevel;
  uStack_a0._4_4_ = params->maxLevel;
  fVar2 = params->maxLod;
  fStack_b4 = extraout_XMM0_Db;
  fVar17 = computeLodFromDerivates
                     (params->lodMode,((fVar17 - fVar20) * local_58) / fVar27,
                      ((fVar21 - fVar1) * local_c8) / fVar27,((fVar19 - fVar20) * local_58) / fVar26
                      ,((fVar24 - fVar1) * local_c8) / fVar26);
  auVar23._0_4_ = local_b8 + (float)local_48;
  auVar23._4_4_ = fVar17 + (float)local_48;
  auVar23._8_4_ = fStack_b4 + (float)local_48;
  auVar23._12_4_ = extraout_XMM0_Db_00 + (float)local_48;
  auVar25._4_4_ = params->maxLod;
  auVar25._0_4_ = fVar2;
  auVar25._8_8_ = 0;
  auVar25 = minps(auVar25,auVar23);
  uVar16 = -(uint)(auVar23._4_4_ < params->minLod);
  local_90 = (float)(~-(uint)(auVar23._0_4_ < (float)local_a8) & auVar25._0_4_ |
                    (uint)(float)local_a8 & -(uint)(auVar23._0_4_ < (float)local_a8));
  uStack_8c = ~uVar16 & auVar25._4_4_ | (uint)params->minLod & uVar16;
  iVar15 = dst->m_height;
  if (0 < iVar15) {
    iVar9 = dst->m_width;
    iVar14 = 0;
    do {
      if (0 < iVar9) {
        iVar15 = 0;
        do {
          auVar22._0_4_ = (float)iVar15 + 0.5;
          auVar22._4_4_ = (float)iVar14 + 0.5;
          auVar22._8_8_ = 0;
          auVar18._0_4_ = (float)iVar9;
          auVar18._4_4_ = (float)dst->m_height;
          auVar18._8_8_ = 0;
          auVar23 = divps(auVar22,auVar18);
          fVar17 = auVar23._4_4_;
          bVar7 = 1.0 <= auVar23._0_4_ + fVar17;
          if (bVar7) {
            auVar23 = ZEXT416((uint)(1.0 - auVar23._0_4_));
            if (!bVar7) goto LAB_009f2dfe;
LAB_009f2de7:
            fVar19 = auVar23._0_4_;
            fVar17 = 1.0 - fVar17;
          }
          else {
            if (bVar7) goto LAB_009f2de7;
LAB_009f2dfe:
            fVar19 = auVar23._0_4_;
          }
          uVar8 = (ulong)bVar7;
          fVar20 = local_f8[uVar8 * 3];
          fVar21 = (local_f8[uVar8 * 3 + 1] - fVar20) * fVar17 +
                   (local_f8[uVar8 * 3 + 2] - fVar20) * fVar19 + fVar20;
          fVar20 = local_118[uVar8 * 3];
          fVar24 = (local_118[uVar8 * 3 + 1] - fVar20) * fVar17 +
                   (local_118[uVar8 * 3 + 2] - fVar20) * fVar19 + fVar20;
          fVar20 = local_138[uVar8 * 3];
          fVar17 = (local_138[uVar8 * 3 + 1] - fVar20) * fVar17 +
                   (local_138[uVar8 * 3 + 2] - fVar20) * fVar19 + fVar20;
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_d8 = (undefined1  [4])
                       tcu::Texture2DArrayView::sampleCompare
                                 ((Texture2DArrayView *)&local_68,&params->sampler,
                                  (params->super_RenderParams).ref,fVar21,fVar24,fVar17,
                                  (&local_90)[uVar8]);
            uStack_d4 = 0;
            fStack_cc = 1.0;
          }
          else {
            tcu::Texture2DArrayView::sample
                      ((Texture2DArrayView *)local_d8,(Sampler *)&local_68,fVar21,fVar24,fVar17,
                       (&local_90)[uVar8]);
          }
          fVar17 = (params->super_RenderParams).colorScale.m_data[0] * (float)local_d8 +
                   (params->super_RenderParams).colorBias.m_data[0];
          fVar19 = (params->super_RenderParams).colorScale.m_data[1] * (float)uStack_d4 +
                   (params->super_RenderParams).colorBias.m_data[1];
          fVar20 = (params->super_RenderParams).colorScale.m_data[2] * uStack_d4._4_4_ +
                   (params->super_RenderParams).colorBias.m_data[2];
          fVar21 = (params->super_RenderParams).colorScale.m_data[3] * fStack_cc +
                   (params->super_RenderParams).colorBias.m_data[3];
          bVar6 = dst->m_colorMask;
          uVar10 = 0;
          uVar16 = 0;
          if ((bVar6 & 1) != 0) {
            uVar11 = 0x7e - ((int)fVar17 >> 0x17);
            uVar16 = (((uint)fVar17 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar11 & 0x1f)) +
                     0x800000;
            if (8 < uVar11) {
              uVar16 = uVar11;
            }
            uVar16 = uVar16 >> 0x18;
          }
          if ((bVar6 & 2) != 0) {
            uVar11 = 0x7e - ((int)fVar19 >> 0x17);
            uVar10 = (((uint)fVar19 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar11 & 0x1f)) +
                     0x800000;
            if (8 < uVar11) {
              uVar10 = uVar11;
            }
            uVar10 = uVar10 >> 0x10 & 0xff00;
          }
          uVar11 = 0;
          if ((bVar6 & 4) != 0) {
            uVar12 = 0x7e - ((int)fVar20 >> 0x17);
            uVar11 = (((uint)fVar20 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar12 & 0x1f)) +
                     0x800000;
            if (8 < uVar12) {
              uVar11 = uVar12;
            }
            uVar11 = uVar11 >> 8 & 0xff0000;
          }
          uVar12 = 0xff000000;
          if ((bVar6 & 8) != 0) {
            uVar13 = 0x7e - ((int)fVar21 >> 0x17);
            uVar12 = (((uint)fVar21 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                     0x800000;
            if (8 < uVar13) {
              uVar12 = uVar13;
            }
            uVar12 = uVar12 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)(dst->m_x + iVar15 + (dst->m_y + iVar14) * dst->m_surface->m_width) * 4) =
               uVar10 | uVar16 | uVar11 | uVar12;
          iVar15 = iVar15 + 1;
          iVar9 = dst->m_width;
        } while (iVar15 < iVar9);
        iVar15 = dst->m_height;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < iVar15);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture2DArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	tcu::Vec4 rq = tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	DE_ASSERT(!(params.flags & ReferenceParams::PROJECTED)); // \todo [2012-02-17 pyry] Support projected lookups.
	sampleTextureNonProjected(dst, src, sq, tq, rq, params);
}